

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

void stream_encoder_mt_end(void *coder_ptr,lzma_allocator *allocator)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  
  threads_end((lzma_stream_coder_conflict1 *)coder_ptr,allocator);
  lzma_outq_end((lzma_outq *)((long)coder_ptr + 0x100),allocator);
  if (*(long *)((long)coder_ptr + 0x10) != -1) {
    plVar3 = (long *)((long)coder_ptr + 0x20);
    do {
      lzma_free((void *)plVar3[-1],allocator);
      lVar1 = *plVar3;
      plVar3 = plVar3 + 2;
    } while (lVar1 != -1);
  }
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 0x68),allocator);
  lzma_index_end(*(lzma_index **)((long)coder_ptr + 0x60),allocator);
  iVar2 = pthread_cond_destroy((pthread_cond_t *)((long)coder_ptr + 400));
  if (iVar2 == 0) {
    iVar2 = pthread_mutex_destroy((pthread_mutex_t *)((long)coder_ptr + 0x168));
    if (iVar2 == 0) {
      lzma_free(coder_ptr,allocator);
      return;
    }
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                  ,0xbc,"void mythread_mutex_destroy(mythread_mutex *)");
  }
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                ,0x104,"void mythread_cond_destroy(mythread_cond *)");
}

Assistant:

static void
stream_encoder_mt_end(void *coder_ptr, const lzma_allocator *allocator)
{
	lzma_stream_coder *coder = coder_ptr;

	// Threads must be killed before the output queue can be freed.
	threads_end(coder, allocator);
	lzma_outq_end(&coder->outq, allocator);

	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	mythread_cond_destroy(&coder->cond);
	mythread_mutex_destroy(&coder->mutex);

	lzma_free(coder, allocator);
	return;
}